

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int str_sub(lua_State *L)

{
  char *pcVar1;
  lua_Integer lVar2;
  ulong uVar3;
  long lVar4;
  size_t l;
  ulong local_20;
  
  pcVar1 = luaL_checklstring(L,1,&local_20);
  lVar2 = luaL_checkinteger(L,2);
  if (lVar2 < 0) {
    if (local_20 < (ulong)-lVar2) {
      lVar2 = 0;
    }
    else {
      lVar2 = lVar2 + local_20 + 1;
    }
  }
  uVar3 = luaL_optinteger(L,3,-1);
  if ((long)uVar3 < 0) {
    if (local_20 < -uVar3) {
      uVar3 = 0;
    }
    else {
      uVar3 = uVar3 + local_20 + 1;
    }
  }
  lVar4 = 1;
  if (1 < lVar2) {
    lVar4 = lVar2;
  }
  if ((long)uVar3 < (long)local_20) {
    local_20 = uVar3;
  }
  if ((long)local_20 < lVar4) {
    lua_pushstring(L,"");
  }
  else {
    lua_pushlstring(L,pcVar1 + lVar4 + -1,(local_20 - lVar4) + 1);
  }
  return 1;
}

Assistant:

static int str_sub(lua_State *L) {
    size_t l;
    const char *s = luaL_checklstring(L, 1, &l);
    lua_Integer start = posrelat(luaL_checkinteger(L, 2), l);
    lua_Integer end = posrelat(luaL_optinteger(L, 3, -1), l);
    if (start < 1) start = 1;
    if (end > (lua_Integer) l) end = l;
    if (start <= end)
        lua_pushlstring(L, s + start - 1, (size_t) (end - start) + 1);
    else
        lua_pushliteral(L, "");
    return 1;
}